

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

bool QFontDatabase::isBitmapScalable(QString *family,QString *style)

{
  QtFontFoundry *pQVar1;
  bool bVar2;
  int iVar3;
  Type *mutex;
  QtFontFamily *pQVar4;
  QtFontStyle **ppQVar5;
  bool bVar6;
  int j;
  long lVar7;
  int k;
  long lVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  Key local_4c;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_88.size = 0;
  parseFontName(family,(QString *)&local_88,(QString *)&local_68);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  mutex = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
          operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                      *)family);
  QMutexLocker<QRecursiveMutex>::QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_48,mutex);
  QFontDatabasePrivate::ensureFontDatabase();
  pQVar4 = QFontDatabasePrivate::family
                     (&QFontDatabasePrivate::instance::instance,(QString *)&local_68,EnsurePopulated
                     );
  if (pQVar4 == (QtFontFamily *)0x0) {
    bVar6 = false;
  }
  else {
    local_4c = (Key)0xaaaaaaaa;
    QtFontStyle::Key::Key(&local_4c,style);
    for (lVar7 = 0; bVar6 = lVar7 < pQVar4->count, lVar7 < pQVar4->count; lVar7 = lVar7 + 1) {
      pQVar1 = pQVar4->foundries[lVar7];
      if (local_88.size == 0) {
LAB_00428697:
        for (lVar8 = 0; lVar8 < pQVar1->count; lVar8 = lVar8 + 1) {
          ppQVar5 = pQVar1->styles;
          if ((style->d).size == 0) {
LAB_004286dc:
            if (((*(uint *)&ppQVar5[lVar8]->field_0x4 & 2) == 0 &
                (byte)*(uint *)&ppQVar5[lVar8]->field_0x4) != 0) goto LAB_004286f3;
          }
          else {
            bVar2 = ::comparesEqual(&ppQVar5[lVar8]->styleName,style);
            ppQVar5 = pQVar1->styles;
            if (bVar2) goto LAB_004286dc;
            bVar2 = QtFontStyle::Key::operator==(&ppQVar5[lVar8]->key,&local_4c);
            if (bVar2) {
              ppQVar5 = pQVar1->styles;
              goto LAB_004286dc;
            }
          }
        }
      }
      else {
        iVar3 = QString::compare((QString *)pQVar1,(CaseSensitivity)&local_88);
        if (iVar3 == 0) goto LAB_00428697;
      }
    }
  }
LAB_004286f3:
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QFontDatabase::isBitmapScalable(const QString &family,
                                      const QString &style)
{
    bool bitmapScalable = false;
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QtFontFamily *f = d->family(familyName);
    if (!f) return bitmapScalable;

    QtFontStyle::Key styleKey(style);
    for (int j = 0; j < f->count; j++) {
        QtFontFoundry *foundry = f->foundries[j];
        if (foundryName.isEmpty() || foundry->name.compare(foundryName, Qt::CaseInsensitive) == 0) {
            for (int k = 0; k < foundry->count; k++)
                if ((style.isEmpty() ||
                     foundry->styles[k]->styleName == style ||
                     foundry->styles[k]->key == styleKey)
                    && foundry->styles[k]->bitmapScalable && !foundry->styles[k]->smoothScalable) {
                    bitmapScalable = true;
                    goto end;
                }
        }
    }
 end:
    return bitmapScalable;
}